

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFComment.cpp
# Opt level: O2

void __thiscall PDFComment::~PDFComment(PDFComment *this)

{
  PDFDate::~PDFDate(&this->Time);
  CMYKRGBColor::~CMYKRGBColor(&this->Color);
  std::__cxx11::string::~string((string *)&this->CommentatorName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PDFComment::~PDFComment(void)
{
}